

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O1

int __thiscall
dg::vr::VRLocation::connect(VRLocation *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 *puVar1;
  int iVar2;
  int extraout_EAX;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  undefined8 *local_20;
  
  local_20 = (undefined8 *)operator_new(0x20);
  *local_20 = this;
  local_20[1] = CONCAT44(in_register_00000034,__fd);
  local_20[2] = __addr;
  *(undefined4 *)(local_20 + 3) = 3;
  iVar2 = connect(this,(int)&local_20,__addr_00,__len);
  puVar1 = local_20;
  if (local_20 != (undefined8 *)0x0) {
    if ((long *)local_20[2] != (long *)0x0) {
      (**(code **)(*(long *)local_20[2] + 8))();
    }
    puVar1[2] = 0;
    operator_delete(puVar1,0x20);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void VRLocation::connect(VRLocation *target, VROp *op) {
    connect(std::unique_ptr<VREdge>(new VREdge(this, target, op)));
}